

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O2

_Bool set_config_dic_dir(OpenJTalk *oj,char *path_original)

{
  _Bool _Var1;
  size_t sVar2;
  size_t sVar3;
  char path [260];
  char full [260];
  char temp [260];
  char local_358 [272];
  char local_248 [272];
  char local_138 [272];
  
  if (g_verbose) {
    console_message(anon_var_dwarf_3cd);
  }
  memset(local_358,0,0x104);
  strcpy(local_358,path_original);
  if (oj == (OpenJTalk *)0x0) {
    return false;
  }
  if (local_358[0] == '\0') {
    return false;
  }
  memset(local_138,0,0x104);
  _Var1 = is_relative(local_358);
  if (_Var1) {
    if (g_verbose != false) {
      console_message_string(anon_var_dwarf_3d8,local_358);
    }
    sVar2 = strlen(g_ini_dir);
    if (sVar2 == 0) {
      return false;
    }
    sVar3 = strlen(local_358);
    if ((sVar3 + sVar2) - 0x103 < 0xfffffffffffffefb) {
      return false;
    }
    strcpy(local_138,g_ini_dir);
    strcat(local_138,G_SLASH_CHAR);
    strcat(local_138,local_358);
  }
  else {
    if (g_verbose != false) {
      console_message_string(anon_var_dwarf_3ef,local_358);
    }
    strcpy(local_138,local_358);
  }
  _Var1 = exists_dir(local_138);
  if (!_Var1) {
    if (g_verbose != false) {
      console_message_string(anon_var_dwarf_406,local_358);
    }
    return false;
  }
  if (g_verbose != false) {
    console_message_string(anon_var_dwarf_41d,local_358);
  }
  memset(local_248,0,0x104);
  get_fullpath(local_138,local_248);
  if (g_verbose == true) {
    console_message_string(anon_var_dwarf_434,local_248);
  }
  _Var1 = check_dic_utf_8(local_248);
  if (!_Var1) {
    console_message(anon_var_dwarf_62e + 0x24);
    return _Var1;
  }
  if (g_verbose == true) {
    console_message_string(anon_var_dwarf_456,local_248);
  }
  strcpy(oj->dn_dic_path,local_248);
  Open_JTalk_load_dic(oj->open_jtalk,local_248);
  return _Var1;
}

Assistant:

bool set_config_dic_dir(OpenJTalk *oj, const char *path_original)
{
	if (g_verbose)
	{
		console_message(u8"設定ファイルの情報から辞書ディレクトリを決定\n");
	}

	char path[MAX_PATH];
	clear_path_string(path, MAX_PATH);
#if defined(_WIN32)
	normalize_back_slash(path_original, path);
#else
	strcpy(path, path_original);
#endif

	if (!oj)
	{
		return false;
	}

	if (path != NULL && strlen(path) == 0)
	{
		return false;
	}

	char temp[MAX_PATH];
	clear_path_string(temp, MAX_PATH);

	if (is_relative(path))
	{
		if (g_verbose)
		{
			console_message_string(u8"設定ファイルの辞書ディレクトリ指定は相対指定です。: %s\n", path);
		}

		if (g_ini_dir == NULL || strlen(g_ini_dir) == 0)
		{
			return false;
		}

		if (strlen(g_ini_dir) + 1 + strlen(path) + 1 > MAX_PATH)
		{
			return false;
		}

		strcpy(temp, g_ini_dir);
		strcat(temp, G_SLASH_CHAR);
		strcat(temp, path);
	}
	else
	{
		if (g_verbose)
		{
			console_message_string(u8"設定ファイルの辞書ディレクトリ指定は相対指定ではありません。: %s\n", path);
		}
		strcpy(temp, path);
	}

	if (!exists_dir(temp))
	{
		if (g_verbose)
		{
			console_message_string(u8"設定ファイルで指定された辞書ディレクトリは存在しません。:  %s\n", path);
		}
		return false;
	}
	else
	{
		if (g_verbose)
		{
			console_message_string(u8"設定ファイルで指定された辞書ディレクトリは実在します。: %s\n", path);
		}
	}

	char full[MAX_PATH];
	char full2[MAX_PATH];
	clear_path_string(full, MAX_PATH);
	clear_path_string(full2, MAX_PATH);
	get_fullpath(temp, full);
	if (g_verbose)
	{
		console_message_string(u8"辞書ディレクトリのフルパス: %s\n", full);
	}

	if (!check_dic_utf_8(full))
	{
		console_message(u8"辞書ファイルの設定に失敗しました。\n");
		return false;
	}

#if defined(_WIN32)
#else
#endif
	if (g_verbose)
	{
		console_message_string(u8"辞書ディレクトリのフルパス： %s\n", full);
	}
	strcpy(oj->dn_dic_path, full);
#if defined(_WIN32)
	char temp2[MAX_PATH];
	clear_path_string(temp2, MAX_PATH);
	u8tosjis_path(full, temp2);
	Open_JTalk_load_dic(oj->open_jtalk, temp2);
#else
	Open_JTalk_load_dic(oj->open_jtalk, full);
#endif
	return true;
}